

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

void __thiscall wasm::OptimizeInstructions::visitArraySet(OptimizeInstructions *this,ArraySet *curr)

{
  Expression **input;
  pointer pFVar1;
  bool bVar2;
  HeapTypeKind HVar3;
  uint bytes;
  Struct *pSVar4;
  Field local_48;
  undefined1 local_38;
  Type local_30;
  HeapType local_28;
  
  input = &curr->ref;
  skipNonNullCast(this,input,(Expression *)curr);
  bVar2 = trapOnNull(this,(Expression *)curr,input);
  if (((!bVar2) && (((curr->value->type).id & 0xfffffffffffffffe) == 2)) &&
     (local_30.id = ((*input)->type).id, (local_30.id & 1) == 0 && 6 < local_30.id)) {
    local_28 = wasm::Type::getHeapType(&local_30);
    HVar3 = HeapType::getKind(&local_28);
    if (HVar3 == Array) {
      HeapType::getArray((HeapType *)&local_48);
    }
    else {
      if (HVar3 != Struct) {
        return;
      }
      pSVar4 = HeapType::getStruct(&local_28);
      pFVar1 = (pSVar4->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_48.type.id = (pFVar1->type).id;
      local_48.packedType = pFVar1->packedType;
      local_48.mutable_ = pFVar1->mutable_;
    }
    local_38 = 1;
    bytes = Field::getByteSize(&local_48);
    optimizeStoredValue(this,&curr->value,bytes);
  }
  return;
}

Assistant:

void visitArraySet(ArraySet* curr) {
    skipNonNullCast(curr->ref, curr);
    if (trapOnNull(curr, curr->ref)) {
      return;
    }

    if (curr->value->type.isInteger()) {
      if (auto field = GCTypeUtils::getField(curr->ref->type)) {
        optimizeStoredValue(curr->value, field->getByteSize());
      }
    }
  }